

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void xmlCleanupOutputCallbacks(void)

{
  int local_c;
  int i;
  
  if (xmlOutputCallbackInitialized != 0) {
    for (local_c = xmlOutputCallbackNr + -1; -1 < local_c; local_c = local_c + -1) {
      xmlOutputCallbackTable[local_c].matchcallback = (xmlOutputMatchCallback)0x0;
      xmlOutputCallbackTable[local_c].opencallback = (xmlOutputOpenCallback)0x0;
      xmlOutputCallbackTable[local_c].writecallback = (xmlOutputWriteCallback)0x0;
      xmlOutputCallbackTable[local_c].closecallback = (xmlOutputCloseCallback)0x0;
    }
    xmlOutputCallbackNr = 0;
    xmlOutputCallbackInitialized = 0;
  }
  return;
}

Assistant:

void
xmlCleanupOutputCallbacks(void)
{
    int i;

    if (!xmlOutputCallbackInitialized)
        return;

    for (i = xmlOutputCallbackNr - 1; i >= 0; i--) {
        xmlOutputCallbackTable[i].matchcallback = NULL;
        xmlOutputCallbackTable[i].opencallback = NULL;
        xmlOutputCallbackTable[i].writecallback = NULL;
        xmlOutputCallbackTable[i].closecallback = NULL;
    }

    xmlOutputCallbackNr = 0;
    xmlOutputCallbackInitialized = 0;
}